

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  MessageLite *this;
  Reflection *this_00;
  bool bVar4;
  Message *tmp;
  Arena *arena;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  Message *rhs_local;
  Message *lhs_local;
  
  local_18 = &rhs->super_MessageLite;
  rhs_local = lhs;
  pAVar1 = MessageLite::GetArena(&lhs->super_MessageLite);
  pAVar2 = MessageLite::GetArena(local_18);
  local_31 = 0;
  if (pAVar1 == pAVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1a6,"lhs->GetArena() != rhs->GetArena()");
    local_31 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  }
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  pAVar1 = MessageLite::GetArena(&rhs_local->super_MessageLite);
  bVar4 = true;
  if (pAVar1 == (Arena *)0x0) {
    pAVar1 = MessageLite::GetArena(local_18);
    bVar4 = pAVar1 != (Arena *)0x0;
  }
  if (!bVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1a7,"lhs->GetArena() != nullptr || rhs->GetArena() != nullptr");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  tmp = (Message *)MessageLite::GetArena(local_18);
  if ((Arena *)tmp == (Arena *)0x0) {
    std::swap<google::protobuf::Message*>(&rhs_local,(Message **)&local_18);
    tmp = (Message *)MessageLite::GetArena(local_18);
  }
  this = &Message::New((Message *)local_18,(Arena *)tmp)->super_MessageLite;
  MessageLite::CheckTypeAndMergeFrom(this,&rhs_local->super_MessageLite);
  (*(rhs_local->super_MessageLite)._vptr_MessageLite[2])();
  MessageLite::CheckTypeAndMergeFrom(&rhs_local->super_MessageLite,local_18);
  this_00 = Message::GetReflection((Message *)local_18);
  Reflection::Swap(this_00,(Message *)this,(Message *)local_18);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
  if (!internal::DebugHardenForceCopyInSwap()) {
    ABSL_DCHECK(lhs->GetArena() != rhs->GetArena());
    ABSL_DCHECK(lhs->GetArena() != nullptr || rhs->GetArena() != nullptr);
  }
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = rhs->GetArena();
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = rhs->GetArena();
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
  if (internal::DebugHardenForceCopyInSwap()) {
    rhs->Clear();
    rhs->CheckTypeAndMergeFrom(*tmp);
    if (arena == nullptr) delete tmp;
  } else {
    rhs->GetReflection()->Swap(tmp, rhs);
  }
}